

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O1

bool __thiscall
jsonnet::Jsonnet::evaluateSnippet(Jsonnet *this,string *filename,string *snippet,string *output)

{
  char *pcVar1;
  size_type *psVar2;
  uint in_EAX;
  char *__s;
  string *psVar3;
  bool bVar4;
  int error;
  undefined8 uStack_38;
  
  if (output == (string *)0x0) {
    bVar4 = false;
  }
  else {
    uStack_38 = (ulong)in_EAX;
    __s = jsonnet_evaluate_snippet
                    (this->vm_,(filename->_M_dataplus)._M_p,(snippet->_M_dataplus)._M_p,
                     (int *)((long)&uStack_38 + 4));
    bVar4 = uStack_38._4_4_ == 0;
    psVar3 = &this->last_error_;
    psVar2 = &(this->last_error_)._M_string_length;
    if (bVar4) {
      psVar3 = output;
      psVar2 = &output->_M_string_length;
    }
    pcVar1 = (char *)*psVar2;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar1,(ulong)__s);
    jsonnet_realloc(this->vm_,__s,0);
  }
  return bVar4;
}

Assistant:

bool Jsonnet::evaluateSnippet(const std::string& filename, const std::string& snippet,
                              std::string* output)
{
    if (output == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output =
        ::jsonnet_evaluate_snippet(vm_, filename.c_str(), snippet.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    output->assign(jsonnet_output);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}